

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * parse_macro_statement(gravity_parser_t *parser)

{
  gravity_lexer_t *lexer_00;
  gtoken_s token_00;
  gtoken_t gVar1;
  uint32_t uVar2;
  int iVar3;
  char *s1;
  gnode_t *pgVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  gtoken_s local_88;
  undefined1 local_60 [8];
  gtoken_s token;
  builtin_macro macro_type;
  char *macroid;
  gtoken_t type;
  gravity_lexer_t *lexer;
  gravity_parser_t *parser_local;
  
  lexer_00 = parser->lexer->p[parser->lexer->n - 1];
  gVar1 = gravity_lexer_next(lexer_00);
  if (gVar1 != TOK_MACRO) {
    __assert_fail("type == TOK_MACRO",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                  ,0x96f,"gnode_t *parse_macro_statement(gravity_parser_t *)");
  }
  gVar1 = gravity_lexer_peek(lexer_00);
  if ((gVar1 == TOK_OP_NOT) && (uVar2 = gravity_lexer_lineno(lexer_00), uVar2 == 1)) {
    gVar1 = gravity_lexer_next(lexer_00);
    if (gVar1 == TOK_OP_NOT) {
      gravity_lexer_skip_line(lexer_00);
      return (gnode_t *)0x0;
    }
    __assert_fail("type == TOK_OP_NOT",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                  ,0x976,"gnode_t *parse_macro_statement(gravity_parser_t *)");
  }
  s1 = parse_identifier(parser);
  if (s1 != (char *)0x0) {
    token.value._4_4_ = 0;
    iVar3 = string_cmp(s1,"unittest");
    if (iVar3 == 0) {
      token.value._4_4_ = 1;
    }
    else {
      iVar3 = string_cmp(s1,"include");
      if (iVar3 == 0) {
        token.value._4_4_ = 2;
      }
      else {
        iVar3 = string_cmp(s1,"push");
        if (iVar3 == 0) {
          token.value._4_4_ = 3;
        }
        else {
          iVar3 = string_cmp(s1,"pop");
          if (iVar3 == 0) {
            token.value._4_4_ = 4;
          }
        }
      }
    }
    free(s1);
    gravity_lexer_token((gtoken_s *)local_60,lexer_00);
    local_60._0_4_ = TOK_MACRO;
    if ((parser->delegate != (gravity_delegate_t *)0x0) &&
       (parser->delegate->parser_callback != (gravity_parser_callback)0x0)) {
      (*parser->delegate->parser_callback)(local_60,parser->delegate->xdata);
    }
    switch(token.value._4_4_) {
    case 0:
      break;
    case 1:
      pgVar4 = parse_unittest_macro(parser);
      return pgVar4;
    case 2:
      pgVar4 = parse_include_macro(parser);
      return pgVar4;
    case 3:
      break;
    case 4:
    }
  }
  gravity_lexer_token(&local_88,lexer_00);
  token_00.lineno = local_88.lineno;
  token_00.type = local_88.type;
  token_00.colno = local_88.colno;
  token_00.position = local_88.position;
  token_00.bytes = local_88.bytes;
  token_00.length = local_88.length;
  token_00.fileid = local_88.fileid;
  token_00.builtin = local_88.builtin;
  token_00.value = local_88.value;
  report_error(parser,GRAVITY_WARNING,token_00,"%s",
               "Unknown macro token. Declaration will be ignored.",in_R8,in_R9);
  return (gnode_t *)0x0;
}

Assistant:

static gnode_t *parse_macro_statement (gravity_parser_t *parser) {
    typedef enum {
        MACRO_UNKNOWN = 0,
        MACRO_UNITEST = 1,
        MACRO_INCLUDE = 2,
        MACRO_PUSH = 3,
        MACRO_POP = 4
    } builtin_macro;

    DEBUG_PARSER("parse_macro_statement");
    DECLARE_LEXER;

    // consume special # symbol
    gtoken_t type = gravity_lexer_next(lexer);
    assert(type == TOK_MACRO);

    // check for #! and interpret #! shebang bash as one line comment
    // only if found on first line
    if (gravity_lexer_peek(lexer) == TOK_OP_NOT && gravity_lexer_lineno(lexer) == 1) {
        // consume special ! symbol
        type = gravity_lexer_next(lexer);
        assert(type == TOK_OP_NOT);

        // skip until EOL
        gravity_lexer_skip_line(lexer);
        return NULL;
    }

    // macro has its own parser because I don't want to mess standard syntax
    const char *macroid = parse_identifier(parser);
    if (macroid == NULL) goto handle_error;

    // check macro
    builtin_macro macro_type = MACRO_UNKNOWN;
    if (string_cmp(macroid, "unittest") == 0) macro_type = MACRO_UNITEST;
    else if (string_cmp(macroid, "include") == 0) macro_type = MACRO_INCLUDE;
    else if (string_cmp(macroid, "push") == 0) macro_type = MACRO_PUSH;
    else if (string_cmp(macroid, "pop") == 0) macro_type = MACRO_POP;
    mem_free(macroid);

    gtoken_s token = gravity_lexer_token(lexer);
    token.type = TOK_MACRO;
    PARSER_CALL_CALLBACK(token);

    switch (macro_type) {
        case MACRO_UNITEST:
            return parse_unittest_macro(parser);
            break;

        case MACRO_INCLUDE:
            return parse_include_macro(parser);
            break;

        case MACRO_PUSH:
            break;

        case MACRO_POP:
            break;

        case MACRO_UNKNOWN:
            break;
    }

handle_error:
    REPORT_WARNING(gravity_lexer_token(lexer), "%s", "Unknown macro token. Declaration will be ignored.");
    return NULL;
}